

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::SetMessageVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  Options *pOVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  uint uVar5;
  uint32 uVar6;
  Descriptor *pDVar7;
  mapped_type *pmVar8;
  FileDescriptor *pFVar9;
  string *psVar10;
  FieldDescriptor *pFVar11;
  EnumDescriptor *this;
  undefined1 in_CL;
  undefined1 qualified;
  int i;
  uint i_00;
  int number;
  char *pcVar12;
  FieldDescriptor *field;
  allocator local_5c9;
  key_type local_5c8;
  allocator local_5a1;
  key_type local_5a0;
  string local_580;
  EnumValueDescriptor *local_560;
  EnumValueDescriptor *default_value;
  key_type local_550;
  allocator local_529;
  key_type local_528;
  allocator local_501;
  key_type local_500;
  string local_4e0;
  allocator local_4b9;
  key_type local_4b8;
  string local_498;
  allocator local_471;
  key_type local_470;
  string local_450;
  allocator local_429;
  key_type local_428;
  allocator local_401;
  string local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator local_399;
  key_type local_398;
  allocator local_371;
  string local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator local_309;
  key_type local_308;
  allocator local_2e1;
  key_type local_2e0;
  allocator local_2b9;
  key_type local_2b8;
  allocator local_291;
  key_type local_290;
  string local_270;
  allocator local_249;
  key_type local_248;
  allocator local_221;
  key_type local_220;
  string local_200;
  allocator local_1d9;
  key_type local_1d8;
  allocator local_1b1;
  string local_1b0;
  FieldDescriptor *local_190;
  FieldDescriptor *val;
  string local_180;
  FieldDescriptor *local_160;
  FieldDescriptor *key;
  key_type local_150;
  allocator local_129;
  key_type local_128;
  allocator local_101;
  key_type local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_b9;
  key_type local_b8;
  string local_98;
  allocator local_61;
  key_type local_60;
  string local_40;
  Options *local_20;
  Options *options_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = options;
  options_local = (Options *)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)descriptor;
  SetCommonFieldVariables(descriptor,variables,options);
  pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)variables_local);
  ClassName_abi_cxx11_(&local_40,(cpp *)pDVar7,(Descriptor *)0x0,(bool)in_CL);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"type",&local_61);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_60);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  pFVar9 = FieldDescriptor::file((FieldDescriptor *)variables_local);
  psVar10 = FileDescriptor::name_abi_cxx11_(pFVar9);
  FileLevelNamespace(&local_98,psVar10);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"file_namespace",&local_b9);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"declared_type",&local_101);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_100);
  pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)variables_local);
  pFVar9 = Descriptor::file(pDVar7);
  bVar2 = HasFastArraySerialization(pFVar9,local_20);
  pcVar12 = "";
  if (bVar2) {
    pcVar12 = "MaybeToArray";
  }
  std::operator+(&local_e0,pmVar8,pcVar12);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"stream_writer",&local_129);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_128);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  psVar10 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)variables_local);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"full_name",(allocator *)((long)&key + 7));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_150);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)psVar10);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&key + 7));
  pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)variables_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"key",(allocator *)((long)&val + 7));
  pFVar11 = Descriptor::FindFieldByName(pDVar7,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&val + 7));
  local_160 = pFVar11;
  pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)variables_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"value",&local_1b1);
  pFVar11 = Descriptor::FindFieldByName(pDVar7,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  local_190 = pFVar11;
  CVar3 = FieldDescriptor::cpp_type(local_160);
  pcVar12 = PrimitiveTypeName(CVar3);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"key_cpp",&local_1d9);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar8,pcVar12);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  CVar3 = FieldDescriptor::cpp_type(local_190);
  qualified = (undefined1)CVar3;
  if (CVar3 == CPPTYPE_ENUM) {
    this = FieldDescriptor::enum_type(local_190);
    ClassName_abi_cxx11_(&local_270,(cpp *)this,(EnumDescriptor *)0x1,(bool)qualified);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,"val_cpp",&local_291);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_290);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::__cxx11::string::~string((string *)&local_270);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"wrapper",&local_2b9);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_2b8);
    std::__cxx11::string::operator=((string *)pmVar8,"EnumEntryWrapper");
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  else if (CVar3 == CPPTYPE_MESSAGE) {
    FieldMessageTypeName_abi_cxx11_(&local_200,(cpp *)local_190,field);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"val_cpp",&local_221);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_220);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::~string((string *)&local_200);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"wrapper",&local_249);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_248);
    std::__cxx11::string::operator=((string *)pmVar8,"EntryWrapper");
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(local_190);
    pcVar12 = PrimitiveTypeName(CVar3);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"val_cpp",&local_2e1);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_2e0);
    std::__cxx11::string::operator=((string *)pmVar8,pcVar12);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_308,"wrapper",&local_309);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_308);
    std::__cxx11::string::operator=((string *)pmVar8,"EntryWrapper");
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
  }
  TVar4 = FieldDescriptor::type(local_160);
  pcVar12 = DeclaredTypeMethodName(TVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,pcVar12,&local_371);
  ToUpper(&local_350,&local_370);
  std::operator+(&local_330,"::google::protobuf::internal::WireFormatLite::TYPE_",&local_350);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"key_wire_type",&local_399);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_398);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_330);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  TVar4 = FieldDescriptor::type(local_190);
  pcVar12 = DeclaredTypeMethodName(TVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,pcVar12,&local_401);
  ToUpper(&local_3e0,&local_400);
  std::operator+(&local_3c0,"::google::protobuf::internal::WireFormatLite::TYPE_",&local_3e0);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"val_wire_type",&local_429);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_428);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)variables_local);
  ClassName_abi_cxx11_(&local_450,(cpp *)pDVar7,(Descriptor *)0x0,(bool)qualified);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"map_classname",&local_471);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_470);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string((string *)&local_450);
  uVar5 = FieldDescriptor::number((FieldDescriptor *)variables_local);
  SimpleItoa_abi_cxx11_(&local_498,(protobuf *)(ulong)uVar5,i);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"number",&local_4b9);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_4b8);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  std::__cxx11::string::~string((string *)&local_498);
  uVar6 = internal::WireFormat::MakeTag((FieldDescriptor *)variables_local);
  SimpleItoa_abi_cxx11_(&local_4e0,(protobuf *)(ulong)uVar6,i_00);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"tag",&local_501);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_500);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::__cxx11::string::~string((string *)&local_4e0);
  pFVar9 = FieldDescriptor::file((FieldDescriptor *)variables_local);
  bVar2 = HasDescriptorMethods(pFVar9,local_20);
  pOVar1 = options_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_528,"lite",&local_529);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_528);
    std::__cxx11::string::operator=((string *)pmVar8,"");
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_550,"lite",(allocator *)((long)&default_value + 7));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_550);
    std::__cxx11::string::operator=((string *)pmVar8,"Lite");
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator((allocator<char> *)((long)&default_value + 7));
  }
  bVar2 = IsProto3Field((FieldDescriptor *)variables_local);
  if ((!bVar2) && (TVar4 = FieldDescriptor::type(local_190), TVar4 == TYPE_ENUM)) {
    local_560 = FieldDescriptor::default_value_enum(local_190);
    uVar5 = EnumValueDescriptor::number(local_560);
    Int32ToString_abi_cxx11_(&local_580,(cpp *)(ulong)uVar5,number);
    pOVar1 = options_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5a0,"default_enum_value",&local_5a1);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pOVar1,&local_5a0);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    std::__cxx11::string::~string((string *)&local_580);
    return;
  }
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c8,"default_enum_value",&local_5c9);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_5c8);
  std::__cxx11::string::operator=((string *)pmVar8,"0");
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor,
                         std::map<string, string>* variables,
                         const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["type"] = ClassName(descriptor->message_type(), false);
  (*variables)["file_namespace"] =
      FileLevelNamespace(descriptor->file()->name());
  (*variables)["stream_writer"] =
      (*variables)["declared_type"] +
      (HasFastArraySerialization(descriptor->message_type()->file(), options)
           ? "MaybeToArray"
           : "");
  (*variables)["full_name"] = descriptor->full_name();

  const FieldDescriptor* key =
      descriptor->message_type()->FindFieldByName("key");
  const FieldDescriptor* val =
      descriptor->message_type()->FindFieldByName("value");
  (*variables)["key_cpp"] = PrimitiveTypeName(key->cpp_type());
  switch (val->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      (*variables)["val_cpp"] = FieldMessageTypeName(val);
      (*variables)["wrapper"] = "EntryWrapper";
      break;
    case FieldDescriptor::CPPTYPE_ENUM:
      (*variables)["val_cpp"] = ClassName(val->enum_type(), true);
      (*variables)["wrapper"] = "EnumEntryWrapper";
      break;
    default:
      (*variables)["val_cpp"] = PrimitiveTypeName(val->cpp_type());
      (*variables)["wrapper"] = "EntryWrapper";
  }
  (*variables)["key_wire_type"] =
      "::google::protobuf::internal::WireFormatLite::TYPE_" +
      ToUpper(DeclaredTypeMethodName(key->type()));
  (*variables)["val_wire_type"] =
      "::google::protobuf::internal::WireFormatLite::TYPE_" +
      ToUpper(DeclaredTypeMethodName(val->type()));
  (*variables)["map_classname"] = ClassName(descriptor->message_type(), false);
  (*variables)["number"] = SimpleItoa(descriptor->number());
  (*variables)["tag"] = SimpleItoa(internal::WireFormat::MakeTag(descriptor));

  if (HasDescriptorMethods(descriptor->file(), options)) {
    (*variables)["lite"] = "";
  } else {
    (*variables)["lite"] = "Lite";
  }

  if (!IsProto3Field(descriptor) &&
      val->type() == FieldDescriptor::TYPE_ENUM) {
    const EnumValueDescriptor* default_value = val->default_value_enum();
    (*variables)["default_enum_value"] = Int32ToString(default_value->number());
  } else {
    (*variables)["default_enum_value"] = "0";
  }
}